

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Gia_Man_t * Abc_NtkFunctionalIsoGia(Abc_Ntk_t *pNtk,int iCo1,int iCo2,int fCommon)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  Abc_Obj_t *pAVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  int *piVar13;
  ulong uVar14;
  int *piVar15;
  int *piVar16;
  int iVar17;
  ulong uVar18;
  int *piVar19;
  
  p = Abc_NtkNodeSupportInt(pNtk,iCo1);
  p_00 = Abc_NtkNodeSupportInt(pNtk,iCo2);
  iVar6 = p->nSize;
  if (iVar6 == p_00->nSize) {
    p_01 = Gia_ManStart(1000);
    pcVar7 = Abc_UtilStrsav(pNtk->pName);
    p_01->pName = pcVar7;
    pcVar7 = Abc_UtilStrsav(pNtk->pSpec);
    p_01->pSpec = pcVar7;
    Gia_ManHashStart(p_01);
    if (fCommon != 0) {
      pVVar8 = Vec_IntAlloc(iVar6);
      piVar1 = p->pArray;
      piVar2 = p_00->pArray;
      pVVar8->nSize = 0;
      uVar18 = 0;
      piVar13 = piVar1;
      piVar15 = piVar2;
      piVar16 = piVar2;
      piVar19 = piVar1;
LAB_006a9c75:
      do {
        uVar14 = (long)piVar19 - (long)piVar1;
        while( true ) {
          if ((piVar1 + iVar6 <= piVar13) || (piVar2 + iVar6 <= piVar16)) {
            for (lVar9 = 0; (int *)(lVar9 + (long)piVar13) < piVar1 + iVar6; lVar9 = lVar9 + 4) {
              *(int *)((long)piVar19 + lVar9) = *(int *)(lVar9 + (long)piVar13);
              uVar14 = uVar14 + 4;
            }
            for (; piVar16 < piVar2 + iVar6; piVar16 = piVar16 + 1) {
              *(int *)((long)piVar2 + uVar18) = *piVar16;
              uVar18 = uVar18 + 4;
            }
            Vec_IntShrink(p,(int)(uVar14 >> 2));
            Vec_IntShrink(p_00,(int)(uVar18 >> 2));
            Vec_IntAppend(p,pVVar8);
            Vec_IntAppend(p_00,pVVar8);
            Vec_IntFree(pVVar8);
            iVar6 = p->nSize;
            if (iVar6 != p_00->nSize) {
              __assert_fail("Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                            ,0x3ec,"Gia_Man_t *Abc_NtkFunctionalIsoGia(Abc_Ntk_t *, int, int, int)")
              ;
            }
            goto LAB_006a9d7c;
          }
          iVar17 = *piVar13;
          iVar3 = *piVar16;
          if (iVar17 == iVar3) {
            Vec_IntPush(pVVar8,iVar17);
            piVar13 = piVar13 + 1;
            piVar16 = piVar16 + 1;
            goto LAB_006a9c75;
          }
          if (iVar3 <= iVar17) break;
          piVar13 = piVar13 + 1;
          *piVar19 = iVar17;
          piVar19 = piVar19 + 1;
          uVar14 = uVar14 + 4;
        }
        piVar16 = piVar16 + 1;
        *piVar15 = iVar3;
        piVar15 = piVar15 + 1;
        uVar18 = uVar18 + 4;
      } while( true );
    }
LAB_006a9d7c:
    pAVar10 = Abc_AigConst1(pNtk);
    iVar17 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    (pAVar10->field_6).iTemp = 1;
    for (; iVar6 != iVar17; iVar17 = iVar17 + 1) {
      iVar3 = Vec_IntEntry(p,iVar17);
      pGVar11 = Gia_ManAppendObj(p_01);
      uVar18 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pVVar8 = p_01->vCis;
      iVar4 = Gia_ObjId(p_01,pGVar11);
      Vec_IntPush(pVVar8,iVar4);
      iVar4 = Gia_ObjId(p_01,pGVar11);
      pAVar10 = Abc_NtkCi(pNtk,iVar3);
      (pAVar10->field_6).iTemp = iVar4 * 2;
    }
    Abc_NtkIncrementTravId(pNtk);
    pAVar10 = Abc_NtkCo(pNtk,iCo1);
    iVar17 = Abc_NtkFunctionalIsoGia_rec
                       (p_01,(Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray]);
    iVar17 = Abc_LitNotCond(iVar17,*(uint *)&pAVar10->field_0x14 >> 10 & 1);
    for (iVar3 = 0; iVar6 != iVar3; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(p_00,iVar3);
      iVar5 = Vec_IntEntry(p_01->vCis,iVar3);
      pGVar11 = Gia_ManObj(p_01,iVar5);
      iVar5 = Gia_ObjId(p_01,(Gia_Obj_t *)((ulong)pGVar11 & 0xfffffffffffffffe));
      if (iVar5 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pAVar10 = Abc_NtkCi(pNtk,iVar4);
      (pAVar10->field_6).iTemp = ((uint)pGVar11 & 1) + iVar5 * 2;
    }
    Abc_NtkIncrementTravId(pNtk);
    pAVar10 = Abc_NtkCo(pNtk,iCo2);
    iVar6 = Abc_NtkFunctionalIsoGia_rec
                      (p_01,(Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray]);
    iVar6 = Abc_LitNotCond(iVar6,*(uint *)&pAVar10->field_0x14 >> 10 & 1);
    Gia_ManAppendCo(p_01,iVar17);
    Gia_ManAppendCo(p_01,iVar6);
    pGVar12 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
  }
  else {
    pGVar12 = (Gia_Man_t *)0x0;
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Abc_NtkFunctionalIsoGia( Abc_Ntk_t * pNtk, int iCo1, int iCo2, int fCommon )
{
    Gia_Man_t * pNew = NULL, * pTemp;
    Vec_Int_t * vSupp1 = Abc_NtkNodeSupportInt( pNtk, iCo1 );
    Vec_Int_t * vSupp2 = Abc_NtkNodeSupportInt( pNtk, iCo2 );
    if ( Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2) )
    {
        Abc_Obj_t * pObj;
        int i, iCi, iLit1, iLit2;
        pNew = Gia_ManStart( 1000 );
        pNew->pName = Abc_UtilStrsav( pNtk->pName );
        pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
        Gia_ManHashStart( pNew );
        // put commom together
        if ( fCommon )
        {
            Vec_Int_t * vCommon = Vec_IntAlloc( Vec_IntSize(vSupp1) );
            Vec_IntTwoRemoveCommon( vSupp1, vSupp2, vCommon );
            Vec_IntAppend( vSupp1, vCommon );
            Vec_IntAppend( vSupp2, vCommon );
            Vec_IntFree( vCommon );
            assert( Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2) );            
        }
        // primary inputs
        Abc_AigConst1(pNtk)->iTemp = 1;
        Vec_IntForEachEntry( vSupp1, iCi, i )
            Abc_NtkCi(pNtk, iCi)->iTemp = Gia_ManAppendCi(pNew);
        // create the first cone
        Abc_NtkIncrementTravId( pNtk );
        pObj = Abc_NtkCo( pNtk, iCo1 );
        iLit1 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Abc_ObjFaninC0(pObj) );
        // primary inputs
        Vec_IntForEachEntry( vSupp2, iCi, i )
            Abc_NtkCi(pNtk, iCi)->iTemp = Gia_ManCiLit(pNew, i);
        // create the second cone
        Abc_NtkIncrementTravId( pNtk );
        pObj = Abc_NtkCo( pNtk, iCo2 );
        iLit2 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pObj) );
        iLit2 = Abc_LitNotCond( iLit2, Abc_ObjFaninC0(pObj) );
        Gia_ManAppendCo( pNew, iLit1 );
        Gia_ManAppendCo( pNew, iLit2 );
        // perform cleanup
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    Vec_IntFree( vSupp1 );
    Vec_IntFree( vSupp2 );
    return pNew;
}